

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::CreateMultiplyNode
          (ScalarEvolutionAnalysis *this,SENode *operand_1,SENode *operand_2)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  int64_t iVar3;
  SEConstantNode *this_00;
  int64_t iVar4;
  SENode *pSVar5;
  pointer pSVar6;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_38;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_30;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> multiply_node;
  SENode *operand_2_local;
  SENode *operand_1_local;
  ScalarEvolutionAnalysis *this_local;
  
  multiply_node._M_t.
  super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
  super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>,_true,_true>
          )operand_2;
  bVar1 = SENode::IsCantCompute(operand_1);
  if ((bVar1) ||
     (bVar1 = SENode::IsCantCompute
                        ((SENode *)
                         multiply_node._M_t.
                         super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                         .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl), bVar1
     )) {
    pSVar5 = CreateCantComputeNode(this);
    return pSVar5;
  }
  iVar2 = (**operand_1->_vptr_SENode)();
  if ((iVar2 == 0) &&
     (iVar2 = (*(code *)**(undefined8 **)
                          multiply_node._M_t.
                          super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl)(),
     iVar2 == 0)) {
    iVar2 = (*operand_1->_vptr_SENode[4])();
    iVar3 = SEConstantNode::FoldToSingleValue((SEConstantNode *)CONCAT44(extraout_var,iVar2));
    this_00 = (SEConstantNode *)
              (**(code **)(*(long *)multiply_node._M_t.
                                    super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                                    .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>.
                                    _M_head_impl + 0x20))();
    iVar4 = SEConstantNode::FoldToSingleValue(this_00);
    pSVar5 = CreateConstant(this,iVar3 * iVar4);
    return pSVar5;
  }
  pSVar6 = (pointer)::operator_new(0x30);
  SEMultiplyNode::SEMultiplyNode((SEMultiplyNode *)pSVar6,this);
  std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>::
  unique_ptr<std::default_delete<spvtools::opt::SENode>,void>
            ((unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>> *)
             &local_30,pSVar6);
  pSVar6 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
           operator->(&local_30);
  (*pSVar6->_vptr_SENode[3])(pSVar6,operand_1);
  pSVar6 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
           operator->(&local_30);
  (*pSVar6->_vptr_SENode[3])
            (pSVar6,multiply_node._M_t.
                    super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                    .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl);
  std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::unique_ptr
            (&local_38,&local_30);
  pSVar5 = GetCachedOrAdd(this,&local_38);
  std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::~unique_ptr
            (&local_38);
  std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::~unique_ptr
            (&local_30);
  return pSVar5;
}

Assistant:

SENode* ScalarEvolutionAnalysis::CreateMultiplyNode(SENode* operand_1,
                                                    SENode* operand_2) {
  // If operands are can't compute then the whole graph is can't compute.
  if (operand_1->IsCantCompute() || operand_2->IsCantCompute())
    return CreateCantComputeNode();

  if (operand_1->GetType() == SENode::Constant &&
      operand_2->GetType() == SENode::Constant) {
    return CreateConstant(operand_1->AsSEConstantNode()->FoldToSingleValue() *
                          operand_2->AsSEConstantNode()->FoldToSingleValue());
  }

  std::unique_ptr<SENode> multiply_node{new SEMultiplyNode(this)};

  multiply_node->AddChild(operand_1);
  multiply_node->AddChild(operand_2);

  return GetCachedOrAdd(std::move(multiply_node));
}